

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedicated.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_14675a::DedicatedState::update
          (DedicatedState *this,ALCcontext *param_1,EffectSlot *slot,EffectProps *props,
          EffectTarget target)

{
  pointer paVar1;
  long lVar2;
  ulong uVar3;
  MixParams *mix;
  RealMixParams *pRVar4;
  float ingain;
  array<float,_16UL> coeffs;
  float local_70 [4];
  array<float,_16UL> local_60;
  
  pRVar4 = target.RealOut;
  mix = target.Main;
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)this->mTargetGains + lVar2) = 0;
  }
  ingain = slot->Gain * (props->Reverb).Density;
  if (slot->EffectType == 0x9001) {
    if ((pRVar4 == (RealMixParams *)0x0) ||
       (uVar3 = (ulong)(pRVar4->ChannelIndex)._M_elems[2], uVar3 == 0xffffffff)) {
      local_70[0] = 0.0;
      local_70[1] = 0.0;
      local_70[2] = -1.0;
      CalcDirectionCoeffs(&local_60,(float (*) [3])local_70,0.0);
      paVar1 = (mix->Buffer).mDataEnd;
      (this->super_EffectState).mOutTarget.mData = (mix->Buffer).mData;
      (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
      ComputePanGains(mix,local_60._M_elems,ingain,(span<float,_16UL>)this->mTargetGains);
      return;
    }
  }
  else {
    if (slot->EffectType != 0x9000) {
      return;
    }
    if (pRVar4 == (RealMixParams *)0x0) {
      return;
    }
    uVar3 = (ulong)(pRVar4->ChannelIndex)._M_elems[3];
    if (uVar3 == 0xffffffff) {
      return;
    }
  }
  paVar1 = (pRVar4->Buffer).mDataEnd;
  (this->super_EffectState).mOutTarget.mData = (pRVar4->Buffer).mData;
  (this->super_EffectState).mOutTarget.mDataEnd = paVar1;
  this->mTargetGains[uVar3] = ingain;
  return;
}

Assistant:

void DedicatedState::update(const ALCcontext*, const EffectSlot *slot,
    const EffectProps *props, const EffectTarget target)
{
    std::fill(std::begin(mTargetGains), std::end(mTargetGains), 0.0f);

    const float Gain{slot->Gain * props->Dedicated.Gain};

    if(slot->EffectType == AL_EFFECT_DEDICATED_LOW_FREQUENCY_EFFECT)
    {
        const ALuint idx{!target.RealOut ? INVALID_CHANNEL_INDEX :
            GetChannelIdxByName(*target.RealOut, LFE)};
        if(idx != INVALID_CHANNEL_INDEX)
        {
            mOutTarget = target.RealOut->Buffer;
            mTargetGains[idx] = Gain;
        }
    }
    else if(slot->EffectType == AL_EFFECT_DEDICATED_DIALOGUE)
    {
        /* Dialog goes to the front-center speaker if it exists, otherwise it
         * plays from the front-center location. */
        const ALuint idx{!target.RealOut ? INVALID_CHANNEL_INDEX :
            GetChannelIdxByName(*target.RealOut, FrontCenter)};
        if(idx != INVALID_CHANNEL_INDEX)
        {
            mOutTarget = target.RealOut->Buffer;
            mTargetGains[idx] = Gain;
        }
        else
        {
            const auto coeffs = CalcDirectionCoeffs({0.0f, 0.0f, -1.0f}, 0.0f);

            mOutTarget = target.Main->Buffer;
            ComputePanGains(target.Main, coeffs.data(), Gain, mTargetGains);
        }
    }
}